

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O0

int checkSymmInfo(DdManager *table,DdHalfWord *symmInfo,int index,int level)

{
  DdHalfWord local_2c;
  int i;
  int level_local;
  int index_local;
  DdHalfWord *symmInfo_local;
  DdManager *table_local;
  
  local_2c = symmInfo[index];
  while( true ) {
    if (local_2c == index) {
      return 1;
    }
    if ((index < (int)local_2c) && (table->perm[(int)local_2c] <= level)) break;
    local_2c = symmInfo[(int)local_2c];
  }
  return 0;
}

Assistant:

static int
checkSymmInfo(
  DdManager * table,
  DdHalfWord * symmInfo,
  int  index,
  int  level)
{
    int i;

    i = symmInfo[index];
    while (i != index) {
        if (index < i && table->perm[i] <= level)
            return(0);
        i = symmInfo[i];
    }
    return(1);

}